

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRS.cpp
# Opt level: O0

bool __thiscall Saturation::LRS::shouldUpdateLimits(LRS *this)

{
  uint uVar1;
  pointer pPVar2;
  bool local_1;
  
  if (*(uint *)(DAT_01333840 + 0x1d0) < 0xb) {
    local_1 = false;
  }
  else {
    shouldUpdateLimits::cnt = shouldUpdateLimits::cnt + 1;
    if (shouldUpdateLimits::cnt != 500) {
      pPVar2 = std::
               unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                             *)0xac6515);
      uVar1 = (*(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer.
                _vptr_ClauseContainer[0x12])();
      if (((uVar1 & 1) == 0) || (shouldUpdateLimits::cnt < 0x33)) {
        return false;
      }
    }
    shouldUpdateLimits::cnt = 0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool LRS::shouldUpdateLimits()
{
  if (env.statistics->activations <= 10)
    return false;

  static unsigned cnt=0;
  cnt++;

  //when there are limits, we check more frequently so we don't skip too much inferences
  if(cnt==500 || (_passive->limitsActive() && cnt>50 ) ) {
    cnt=0;
    return true;
  }
  return false;
}